

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::BeginComboPreview(void)

{
  ImGuiComboPreviewData *clip_rect_min;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  ImVec2 IVar6;
  ImGuiWindow *pIVar7;
  ImVec2 IVar8;
  ImGuiComboPreviewData *pIVar9;
  ImGuiContext *pIVar10;
  float fVar11;
  float fVar12;
  
  pIVar10 = GImGui;
  pIVar7 = GImGui->CurrentWindow;
  if (pIVar7->SkipItems == false) {
    fVar1 = (GImGui->LastItemData).Rect.Min.y;
    fVar2 = (pIVar7->ClipRect).Max.y;
    if ((fVar1 < fVar2) &&
       (fVar3 = (pIVar7->ClipRect).Min.y, fVar3 < (GImGui->LastItemData).Rect.Max.y)) {
      fVar12 = (GImGui->LastItemData).Rect.Min.x;
      fVar4 = (pIVar7->ClipRect).Max.x;
      if ((fVar12 < fVar4) &&
         (fVar5 = (pIVar7->ClipRect).Min.x, fVar5 < (GImGui->LastItemData).Rect.Max.x)) {
        clip_rect_min = &GImGui->ComboPreviewData;
        fVar11 = (clip_rect_min->PreviewRect).Min.x;
        if ((fVar12 == fVar11) && (!NAN(fVar12) && !NAN(fVar11))) {
          fVar12 = (GImGui->ComboPreviewData).PreviewRect.Min.y;
          if ((fVar1 == fVar12) && (!NAN(fVar1) && !NAN(fVar12))) {
            if (fVar11 < fVar5) {
              return false;
            }
            if (fVar12 < fVar3) {
              return false;
            }
            if (fVar4 < (GImGui->ComboPreviewData).PreviewRect.Max.x) {
              return false;
            }
            if (fVar2 < (GImGui->ComboPreviewData).PreviewRect.Max.y) {
              return false;
            }
            pIVar9 = &GImGui->ComboPreviewData;
            (GImGui->ComboPreviewData).BackupCursorPos = (pIVar7->DC).CursorPos;
            (pIVar10->ComboPreviewData).BackupCursorMaxPos = (pIVar7->DC).CursorMaxPos;
            (pIVar10->ComboPreviewData).BackupCursorPosPrevLine = (pIVar7->DC).CursorPosPrevLine;
            (pIVar10->ComboPreviewData).BackupPrevLineTextBaseOffset =
                 (pIVar7->DC).PrevLineTextBaseOffset;
            (pIVar10->ComboPreviewData).BackupLayout = (pIVar7->DC).LayoutType;
            IVar6 = (pIVar10->Style).FramePadding;
            fVar11 = fVar11 + IVar6.x;
            fVar12 = fVar12 + IVar6.y;
            IVar6.y = fVar12;
            IVar6.x = fVar11;
            (pIVar7->DC).CursorPos = IVar6;
            IVar8.y = fVar12;
            IVar8.x = fVar11;
            (pIVar7->DC).CursorMaxPos = IVar8;
            (pIVar7->DC).LayoutType = 0;
            (pIVar7->DC).IsSameLine = false;
            PushClipRect((ImVec2 *)clip_rect_min,&(pIVar9->PreviewRect).Max,true);
            return true;
          }
        }
        __assert_fail("g.LastItemData.Rect.Min.x == preview_data->PreviewRect.Min.x && g.LastItemData.Rect.Min.y == preview_data->PreviewRect.Min.y"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/imgui-src/imgui_widgets.cpp"
                      ,0x6c2,"bool ImGui::BeginComboPreview()");
      }
    }
  }
  return false;
}

Assistant:

bool ImGui::BeginComboPreview()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiComboPreviewData* preview_data = &g.ComboPreviewData;

    if (window->SkipItems || !window->ClipRect.Overlaps(g.LastItemData.Rect)) // FIXME: Because we don't have a ImGuiItemStatusFlags_Visible flag to test last ItemAdd() result
        return false;
    IM_ASSERT(g.LastItemData.Rect.Min.x == preview_data->PreviewRect.Min.x && g.LastItemData.Rect.Min.y == preview_data->PreviewRect.Min.y); // Didn't call after BeginCombo/EndCombo block or forgot to pass ImGuiComboFlags_CustomPreview flag?
    if (!window->ClipRect.Contains(preview_data->PreviewRect)) // Narrower test (optional)
        return false;

    // FIXME: This could be contained in a PushWorkRect() api
    preview_data->BackupCursorPos = window->DC.CursorPos;
    preview_data->BackupCursorMaxPos = window->DC.CursorMaxPos;
    preview_data->BackupCursorPosPrevLine = window->DC.CursorPosPrevLine;
    preview_data->BackupPrevLineTextBaseOffset = window->DC.PrevLineTextBaseOffset;
    preview_data->BackupLayout = window->DC.LayoutType;
    window->DC.CursorPos = preview_data->PreviewRect.Min + g.Style.FramePadding;
    window->DC.CursorMaxPos = window->DC.CursorPos;
    window->DC.LayoutType = ImGuiLayoutType_Horizontal;
    window->DC.IsSameLine = false;
    PushClipRect(preview_data->PreviewRect.Min, preview_data->PreviewRect.Max, true);

    return true;
}